

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  ushort x;
  _Bool _Var1;
  uint end_index;
  uint uVar2;
  roaring_array_t *ra;
  ulong uVar3;
  container_t *c;
  roaring_bitmap_t *prVar4;
  byte bVar5;
  uint uVar6;
  uint pos;
  ulong uVar7;
  uint8_t result_type;
  byte local_41;
  uint32_t local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_41 = 0;
  local_40 = (x1->high_low_container).size;
  if (local_40 == 0) {
    ra = &roaring_bitmap_create()->high_low_container;
    bVar5 = 1;
    if (((x1->high_low_container).flags & 1) == 0) {
      bVar5 = (x2->high_low_container).flags & 1;
    }
    ra->flags = ra->flags & 0xfe | bVar5;
  }
  else {
    local_38 = (x2->high_low_container).size;
    if (local_38 == 0) {
      prVar4 = roaring_bitmap_copy(x1);
      return prVar4;
    }
    ra = &roaring_bitmap_create_with_capacity(local_40)->high_low_container;
    bVar5 = 1;
    if (((x1->high_low_container).flags & 1) == 0) {
      bVar5 = (x2->high_low_container).flags & 1;
    }
    ra->flags = ra->flags & 0xfe | bVar5;
    uVar2 = 0;
    uVar7 = 0;
LAB_00105bab:
    do {
      uVar6 = uVar2 & 0xffff;
      local_3c = uVar2;
      while( true ) {
        uVar3 = uVar7 & 0xffff;
        key = (x1->high_low_container).keys[uVar3];
        x = (x2->high_low_container).keys[uVar6];
        pos = (uint)uVar7;
        if (key == x) break;
        if (x <= key) {
          uVar2 = ra_advance_until(&x2->high_low_container,key,local_3c);
          if (uVar2 == local_38) goto LAB_00105cda;
          goto LAB_00105bab;
        }
        end_index = ra_advance_until(&x1->high_low_container,x,pos);
        ra_append_copy_range
                  (ra,&x1->high_low_container,pos,end_index,
                   (_Bool)((x1->high_low_container).flags & 1));
        uVar7 = (ulong)end_index;
        uVar2 = local_3c;
        pos = local_40;
        if (end_index == local_40) goto LAB_00105cd4;
      }
      c = container_andnot((x1->high_low_container).containers[uVar3],
                           (x1->high_low_container).typecodes[uVar3],
                           (x2->high_low_container).containers[uVar6],
                           (x2->high_low_container).typecodes[uVar6],&local_41);
      local_34 = (uint)local_41;
      _Var1 = container_nonzero_cardinality(c,local_41);
      if (_Var1) {
        ra_append(ra,key,c,(uint8_t)local_34);
      }
      else {
        container_free(c,(uint8_t)local_34);
      }
      pos = pos + 1;
      uVar7 = (ulong)pos;
      uVar2 = local_3c + 1;
    } while ((pos != local_40) && (uVar2 != local_38));
LAB_00105cd4:
    if (uVar2 == local_38) {
LAB_00105cda:
      ra_append_copy_range
                (ra,&x1->high_low_container,pos,local_40,(_Bool)((x1->high_low_container).flags & 1)
                );
    }
  }
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap,
                                         is_cow(x1) || is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_andnot(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}